

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Attribute_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Attribute_PDU::Decode(Attribute_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  pointer pAVar1;
  pointer pAVar2;
  KUINT16 KVar3;
  KException *this_00;
  int iVar4;
  undefined7 in_register_00000011;
  ushort uVar5;
  pointer pAVar6;
  AttributeRecordSet local_68;
  
  KVar3 = KDataStream::GetBufferSize(stream);
  iVar4 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar4 = 0;
  }
  if (iVar4 + (uint)KVar3 < 0x20) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    local_68.super_DataTypeBase._vptr_DataTypeBase =
         (_func_int **)&local_68.m_EntityID.super_SimulationIdentifier.m_ui16SiteID;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Decode","");
    KException::KException(this_00,(KString *)&local_68,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  pAVar1 = (this->m_vAttributeRecordSets).
           super__Vector_base<KDIS::DATA_TYPE::AttributeRecordSet,_std::allocator<KDIS::DATA_TYPE::AttributeRecordSet>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pAVar2 = (this->m_vAttributeRecordSets).
           super__Vector_base<KDIS::DATA_TYPE::AttributeRecordSet,_std::allocator<KDIS::DATA_TYPE::AttributeRecordSet>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pAVar6 = pAVar1;
  if (pAVar2 != pAVar1) {
    do {
      (**(pAVar6->super_DataTypeBase)._vptr_DataTypeBase)(pAVar6);
      pAVar6 = pAVar6 + 1;
    } while (pAVar6 != pAVar2);
    (this->m_vAttributeRecordSets).
    super__Vector_base<KDIS::DATA_TYPE::AttributeRecordSet,_std::allocator<KDIS::DATA_TYPE::AttributeRecordSet>_>
    ._M_impl.super__Vector_impl_data._M_finish = pAVar1;
  }
  Header7::Decode(&this->super_Header,stream,ignoreHeader);
  (*(this->m_OrigSimAddr).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_OrigSimAddr,stream);
  KDataStream::Read<unsigned_int>(stream,&this->m_ui32Padding);
  KDataStream::Read<unsigned_short>(stream,&this->m_ui16Padding);
  KDataStream::Read(stream,&this->m_ui8ExtPDUType);
  KDataStream::Read(stream,&this->m_ui8ExtProtocolVersion);
  KDataStream::Read<unsigned_int>(stream,&this->m_ui32MasterRecType);
  KDataStream::Read(stream,&this->m_ui8ActionCode);
  KDataStream::Read(stream,&this->m_ui8Padding1);
  KDataStream::Read<unsigned_short>(stream,&this->m_ui16NumAttrRecSets);
  if (this->m_ui16NumAttrRecSets != 0) {
    uVar5 = 0;
    do {
      DATA_TYPE::AttributeRecordSet::AttributeRecordSet(&local_68,stream);
      std::
      vector<KDIS::DATA_TYPE::AttributeRecordSet,_std::allocator<KDIS::DATA_TYPE::AttributeRecordSet>_>
      ::emplace_back<KDIS::DATA_TYPE::AttributeRecordSet>(&this->m_vAttributeRecordSets,&local_68);
      DATA_TYPE::AttributeRecordSet::~AttributeRecordSet(&local_68);
      uVar5 = uVar5 + 1;
    } while (uVar5 < this->m_ui16NumAttrRecSets);
  }
  return;
}

Assistant:

void Attribute_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < ATTRIBUTE_PDU_SIZE  )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vAttributeRecordSets.clear();

    Header::Decode( stream, ignoreHeader );

    stream >> KDIS_STREAM m_OrigSimAddr
           >> m_ui32Padding
           >> m_ui16Padding
           >> m_ui8ExtPDUType
           >> m_ui8ExtProtocolVersion
           >> m_ui32MasterRecType
           >> m_ui8ActionCode
           >> m_ui8Padding1
           >> m_ui16NumAttrRecSets;

    for( KUINT16 i = 0; i < m_ui16NumAttrRecSets; ++i )
    {
        m_vAttributeRecordSets.push_back( AttributeRecordSet( stream ) );
    }
}